

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_hdu_clear(NGP_HDU *ngph)

{
  int *in_RDI;
  int i;
  int local_14;
  int local_4;
  
  if (in_RDI == (int *)0x0) {
    local_4 = 0x16a;
  }
  else {
    for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
      if ((*(int *)(*(long *)(in_RDI + 2) + (long)local_14 * 0xb0) == 2) &&
         (*(long *)(*(long *)(in_RDI + 2) + (long)local_14 * 0xb0 + 0x50) != 0)) {
        free(*(void **)(*(long *)(in_RDI + 2) + (long)local_14 * 0xb0 + 0x50));
        *(undefined8 *)(*(long *)(in_RDI + 2) + (long)local_14 * 0xb0 + 0x50) = 0;
      }
    }
    if (*(long *)(in_RDI + 2) != 0) {
      free(*(void **)(in_RDI + 2));
    }
    in_RDI[2] = 0;
    in_RDI[3] = 0;
    *in_RDI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int	ngp_hdu_clear(NGP_HDU *ngph)
 { int i;

   if (NULL == ngph) return(NGP_NUL_PTR);

   for (i=0; i<ngph->tokcnt; i++)
    { if (NGP_TTYPE_STRING == ngph->tok[i].type)
        if (NULL != ngph->tok[i].value.s)
          { ngp_free(ngph->tok[i].value.s);
            ngph->tok[i].value.s = NULL;
          }
    }

   if (NULL != ngph->tok) ngp_free(ngph->tok);

   ngph->tok = NULL;
   ngph->tokcnt = 0;

   return(NGP_OK);
 }